

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>
::
Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>
           *this,uint numberOfColumns,Column_settings *colSettings,
          function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
          function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  undefined8 *puVar1;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  value_type_conflict local_54;
  _Any_data local_50;
  code *local_40;
  undefined8 uStack_38;
  
  *(undefined4 *)this = 0xffffffff;
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_78,birthComparator);
  std::function<bool_(unsigned_int,_unsigned_int)>::function
            ((function<bool_(unsigned_int,_unsigned_int)> *)&local_50,deathComparator);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)(this + 8) = local_78._M_unused._M_object;
    *(undefined8 *)(this + 0x10) = local_78._8_8_;
    *(code **)(this + 0x18) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = uStack_38;
  if (local_40 != (code *)0x0) {
    *(void **)(this + 0x28) = local_50._M_unused._M_object;
    *(undefined8 *)(this + 0x30) = local_50._8_8_;
    *(code **)(this + 0x38) = local_40;
    local_40 = (code *)0x0;
    uStack_38 = 0;
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[3] = puVar1 + 1;
  puVar1[4] = puVar1 + 1;
  puVar1[5] = 0;
  *(undefined8 **)(this + 0x78) = puVar1;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined4 *)(this + 0xb0) = 0;
  *(Column_settings **)(this + 0xb8) = colSettings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>_>_>
  ::reserve((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>_>_>
             *)(this + 0x80),(ulong)numberOfColumns);
  local_54 = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x98),
             (ulong)numberOfColumns,&local_54);
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(unsigned int numberOfColumns,
                                                 Column_settings* colSettings,
                                                 const BirthComparatorFunction& birthComparator,
                                                 const DeathComparatorFunction& deathComparator)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(birthComparator, deathComparator),
      Rep_opt(),
      RA_opt(numberOfColumns),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(numberOfColumns);
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
}